

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O1

CoherentFlags __thiscall
spv::Builder::AccessChain::CoherentFlags::operator|=(CoherentFlags *this,CoherentFlags *other)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  
  uVar2 = *(ushort *)other & 1;
  uVar1 = SUB42(*this,0);
  *(ushort *)this = uVar2 | uVar1;
  uVar3 = (*(ushort *)other | uVar1) & 2;
  *(ushort *)this = uVar2 | uVar1 & 0xfffd | uVar3;
  uVar4 = (*(ushort *)other | uVar1) & 4;
  *(ushort *)this = uVar2 | uVar1 & 0xfff9 | uVar3 | uVar4;
  uVar5 = (*(ushort *)other | uVar1) & 8;
  *(ushort *)this = uVar2 | uVar1 & 0xfff1 | uVar3 | uVar4 | uVar5;
  uVar6 = (*(ushort *)other | uVar1) & 0x10;
  *(ushort *)this = uVar2 | uVar1 & 0xffe1 | uVar3 | uVar4 | uVar5 | uVar6;
  uVar7 = (*(ushort *)other | uVar1) & 0x20;
  *(ushort *)this = uVar2 | uVar1 & 0xffc1 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7;
  uVar8 = (*(ushort *)other | uVar1) & 0x40;
  *(ushort *)this = uVar2 | uVar1 & 0xff81 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8;
  uVar9 = (*(ushort *)other | uVar1) & 0x80;
  *(ushort *)this = uVar2 | uVar1 & 0xff01 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8 | uVar9;
  uVar10 = *(ushort *)other & 0x100;
  *(ushort *)this =
       uVar2 | uVar1 & 0xfe01 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8 | uVar9 | uVar10;
  uVar11 = (*(ushort *)other | uVar1) & 0x200;
  *(ushort *)this =
       uVar2 | uVar1 & 0xfc01 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8 | uVar9 | uVar10 |
       uVar11;
  *(ushort *)this =
       uVar2 | uVar1 & 0xf801 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8 | uVar9 | uVar10 |
       uVar11 | (*(ushort *)other | uVar1) & 0x400;
  return *this;
}

Assistant:

CoherentFlags operator |=(const CoherentFlags &other) {
                coherent |= other.coherent;
                devicecoherent |= other.devicecoherent;
                queuefamilycoherent |= other.queuefamilycoherent;
                workgroupcoherent |= other.workgroupcoherent;
                subgroupcoherent |= other.subgroupcoherent;
                shadercallcoherent |= other.shadercallcoherent;
                nonprivate |= other.nonprivate;
                volatil |= other.volatil;
                nontemporal = other.nontemporal;
                isImage |= other.isImage;
                nonUniform |= other.nonUniform;
                return *this;
            }